

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstExpr.h
# Opt level: O0

String * __thiscall
nigel::AstReturning::returnTypeString_abi_cxx11_
          (String *__return_storage_ptr__,AstReturning *this,BasicType type)

{
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [16];
  allocator local_15;
  int local_14;
  String *pSStack_10;
  BasicType type_local;
  
  local_14 = (int)this;
  pSStack_10 = __return_storage_ptr__;
  if (local_14 == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"byte",&local_15);
    std::allocator<char>::~allocator((allocator<char> *)&local_15);
  }
  else if (local_14 == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"int",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
  }
  else if (local_14 == 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"unsigned byte",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
  }
  else if (local_14 == 4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"unsigned int",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"-!-UNKNOWN-!-",&local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

static String returnTypeString( BasicType type )
		{
			if( type == tByte ) return "byte";
			else if( type == tInt ) return "int";
			else if( type == tUbyte ) return "unsigned byte";
			else if( type == tUint ) return "unsigned int";
			else return "-!-UNKNOWN-!-";
		}